

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetLengthPrefixedSlice(char *p,char *limit,Slice *result)

{
  long lVar1;
  uint32_t *in_RDX;
  Slice *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint32_t len;
  size_t in_stack_ffffffffffffffb8;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = GetVarint32Ptr(in_RDI,(char *)in_RSI,in_RDX);
  if (local_28 == (char *)0x0) {
    local_28 = (char *)0x0;
  }
  else if (in_RSI < (Slice *)(local_28 + local_c)) {
    local_28 = (char *)0x0;
  }
  else {
    Slice::Slice(in_RSI,(char *)in_RDX,in_stack_ffffffffffffffb8);
    *(undefined8 *)in_RDX = local_20;
    *(undefined8 *)(in_RDX + 2) = local_18;
    local_28 = local_28 + local_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

const char* GetLengthPrefixedSlice(const char* p, const char* limit,
                                   Slice* result) {
  uint32_t len;
  p = GetVarint32Ptr(p, limit, &len);
  if (p == nullptr) return nullptr;
  if (p + len > limit) return nullptr;
  *result = Slice(p, len);
  return p + len;
}